

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O0

uint32 __thiscall
Protocol::MQTT::Common::DynamicBinaryData::readFrom
          (DynamicBinaryData *this,uint8 *buffer,uint32 bufLength)

{
  uint16 uVar1;
  uint8 *puVar2;
  uint16 size;
  uint32 bufLength_local;
  uint8 *buffer_local;
  DynamicBinaryData *this_local;
  
  if (bufLength < 2) {
    this_local._4_4_ = 0xfffffffe;
  }
  else {
    uVar1 = BigEndian(*(uint16 *)buffer);
    this->length = uVar1;
    if (bufLength < this->length + 2) {
      this_local._4_4_ = 0xfffffffe;
    }
    else {
      puVar2 = (uint8 *)Platform::safeRealloc(this->data,(ulong)this->length);
      this->data = puVar2;
      memcpy(this->data,buffer + 2,(ulong)this->length);
      this_local._4_4_ = this->length + 2;
    }
  }
  return this_local._4_4_;
}

Assistant:

uint32 readFrom(const uint8 * buffer, uint32 bufLength)
                {
                    if (bufLength < 2) return NotEnoughData;
                    uint16 size = 0; memcpy(&size, buffer, 2); length = BigEndian(size);
                    if ((uint32)(length+2) > bufLength) return NotEnoughData;
                    data = (uint8*)Platform::safeRealloc(data, length);
                    memcpy(data, buffer+2, length);
                    return (uint32)length + 2;
                }